

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int ucstricmp8(char *utf8,char *utf8end,QChar *utf16,QChar *utf16end)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  char32_t cVar4;
  QChar *in_RCX;
  QChar *in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  long in_FS_OFFSET;
  int diff;
  char32_t uc2;
  qsizetype res;
  uchar b;
  char32_t *uc1;
  uchar *end1;
  char32_t *output;
  QStringIterator src2;
  uchar *src1;
  char32_t decoded [1];
  char32_t in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  char32_t in_stack_ffffffffffffff7c;
  uchar *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  char32_t **dst;
  int local_3c;
  QStringIterator local_30;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.i = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_30.pos = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_30.e = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = in_RDI;
  QStringIterator::QStringIterator(&local_30,in_RDX,in_RCX);
  while( true ) {
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
    if (local_18 < in_RSI) {
      bVar2 = QStringIterator::hasNext((QStringIterator *)0x50796a);
      in_stack_ffffffffffffff74 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff74);
    }
    if ((char)((uint)in_stack_ffffffffffffff74 >> 0x18) == '\0') break;
    local_c = 0xaaaaaaaa;
    dst = (char32_t **)&local_c;
    uVar1 = *local_18;
    local_18 = local_18 + 1;
    in_stack_ffffffffffffff80 =
         (uchar *)QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                            ((uchar)((ulong)in_RSI >> 0x38),dst,
                             (uchar **)CONCAT17(uVar1,in_stack_ffffffffffffff88),
                             in_stack_ffffffffffffff80);
    if ((long)in_stack_ffffffffffffff80 < 0) {
      *(undefined4 *)dst = 0xfffd;
    }
    else {
      cVar4 = QChar::toCaseFolded(L'\x00507a12');
      *(char32_t *)dst = cVar4;
    }
    QStringIterator::next
              ((QStringIterator *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74);
    in_stack_ffffffffffffff7c = QChar::toCaseFolded(L'\x00507a31');
    local_3c = *(int *)dst - in_stack_ffffffffffffff7c;
    if (local_3c != 0) goto LAB_00507a8f;
    in_stack_ffffffffffffff78 = 0;
  }
  bVar2 = local_18 < in_RSI;
  bVar3 = QStringIterator::hasNext((QStringIterator *)0x507a7d);
  local_3c = (uint)bVar2 - (uint)bVar3;
LAB_00507a8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp8(const char *utf8, const char *utf8end, const QChar *utf16, const QChar *utf16end)
{
    auto src1 = reinterpret_cast<const uchar *>(utf8);
    auto end1 = reinterpret_cast<const uchar *>(utf8end);
    QStringIterator src2(utf16, utf16end);

    while (src1 < end1 && src2.hasNext()) {
        char32_t decoded[1];
        char32_t *output = decoded;
        char32_t &uc1 = decoded[0];
        uchar b = *src1++;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        } else {
            uc1 = QChar::toCaseFolded(uc1);
        }

        char32_t uc2 = QChar::toCaseFolded(src2.next());
        int diff = uc1 - uc2;   // can't underflow
        if (diff)
            return diff;
    }

    // the shorter string sorts first
    return (end1 > src1) - int(src2.hasNext());
}